

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O2

Error asmjit::v1_14::VirtMem::mapMemory
                (void **p,size_t size,MemoryFlags memoryFlags,int fd,off_t offset)

{
  long lVar1;
  int __prot;
  Error EVar2;
  void *__addr;
  size_t sVar3;
  int *piVar4;
  int __flags;
  
  *p = (void *)0x0;
  if (size == 0) {
    return 2;
  }
  __prot = mmProtFromMemoryFlags(memoryFlags);
  __flags = (uint)((memoryFlags >> 8 & 1) == 0) + (uint)(fd == -1) * 0x20 + 1;
  if ((memoryFlags >> 9 & 1) != 0) {
    sVar3 = largePageSize();
    if (sVar3 == 0) {
      return 7;
    }
    if (size % sVar3 != 0) {
      return 2;
    }
    lVar1 = 0;
    if (sVar3 != 0) {
      for (; (sVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    __flags = __flags + (int)lVar1 * 0x4000000 + 0x40000;
  }
  __addr = mmap((void *)0x0,size,__prot,__flags,fd,0);
  if (__addr != (void *)0xffffffffffffffff) {
    if ((memoryFlags >> 9 & 1) != 0) {
      madvise(__addr,size,0xe);
    }
    *p = __addr;
    return 0;
  }
  piVar4 = __errno_location();
  EVar2 = asmjitErrorFromErrno(*piVar4);
  return EVar2;
}

Assistant:

static Error mapMemory(void** p, size_t size, MemoryFlags memoryFlags, int fd = -1, off_t offset = 0) noexcept {
  *p = nullptr;
  if (size == 0)
    return DebugUtils::errored(kErrorInvalidArgument);

  int protection = mmProtFromMemoryFlags(memoryFlags) | mmMaxProtFromMemoryFlags(memoryFlags);
  int mmFlags = mmMapJitFromMemoryFlags(memoryFlags);

  mmFlags |= Support::test(memoryFlags, MemoryFlags::kMapShared) ? MAP_SHARED : MAP_PRIVATE;
  if (fd == -1)
    mmFlags |= MAP_ANONYMOUS;

  bool useLargePages = Support::test(memoryFlags, VirtMem::MemoryFlags::kMMapLargePages);

  if (useLargePages) {
#if defined(__linux__)
    size_t lpSize = largePageSize();
    if (lpSize == 0)
      return DebugUtils::errored(kErrorFeatureNotEnabled);

    if (!Support::isAligned(size, lpSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    unsigned lpSizeLog2 = Support::ctz(lpSize);
    mmFlags |= int(unsigned(MAP_HUGETLB) | (lpSizeLog2 << MAP_HUGE_SHIFT));
#else
    return DebugUtils::errored(kErrorFeatureNotEnabled);
#endif // __linux__
  }

  void* ptr = mmap(nullptr, size, protection, mmFlags, fd, offset);
  if (ptr == MAP_FAILED)
    return DebugUtils::errored(asmjitErrorFromErrno(errno));

#if defined(MADV_HUGEPAGE)
  if (useLargePages) {
    madvise(ptr, size, MADV_HUGEPAGE);
  }
#endif

  *p = ptr;
  return kErrorOk;
}